

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_cont.c
# Opt level: O0

_light_pcapng_mem * light_no_copy_from_memory(uint32_t *memory,size_t size,int is_owner)

{
  _light_pcapng_mem *p_Var1;
  int in_EDX;
  size_t in_RSI;
  uint32_t *in_RDI;
  _light_pcapng_mem *unaff_retaddr;
  _light_pcapng_mem *head;
  
  p_Var1 = (_light_pcapng_mem *)calloc(1,0x28);
  __parse_mem_inplace(unaff_retaddr,in_RDI,in_RSI,in_EDX);
  return p_Var1;
}

Assistant:

struct _light_pcapng_mem *light_no_copy_from_memory(uint32_t *memory, size_t size, int is_owner)
{
	struct _light_pcapng_mem *head = NULL;
	head = calloc(1, sizeof(struct _light_pcapng_mem));
	__parse_mem_inplace(head, memory, size, is_owner);
	return head;
}